

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

int BZ2_bzCompressEnd(bz_stream *strm)

{
  long *plVar1;
  long in_RDI;
  EState *s;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -2;
  }
  else {
    plVar1 = *(long **)(in_RDI + 0x30);
    if (plVar1 == (long *)0x0) {
      local_4 = -2;
    }
    else if (*plVar1 == in_RDI) {
      if (plVar1[3] != 0) {
        (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),plVar1[3]);
      }
      if (plVar1[4] != 0) {
        (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),plVar1[4]);
      }
      if (plVar1[5] != 0) {
        (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),plVar1[5]);
      }
      (**(code **)(in_RDI + 0x40))(*(undefined8 *)(in_RDI + 0x48),*(undefined8 *)(in_RDI + 0x30));
      *(undefined8 *)(in_RDI + 0x30) = 0;
      local_4 = 0;
    }
    else {
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

int BZ_API(BZ2_bzCompressEnd)  ( bz_stream *strm )
{
   EState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   if (s->arr1 != NULL) BZFREE(s->arr1);
   if (s->arr2 != NULL) BZFREE(s->arr2);
   if (s->ftab != NULL) BZFREE(s->ftab);
   BZFREE(strm->state);

   strm->state = NULL;   

   return BZ_OK;
}